

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  int iVar7;
  char *pcVar8;
  uint *puVar9;
  byte bVar10;
  undefined4 unaff_EBP;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  
  pcVar8 = (ctx->SettingsTables).Buf.Data;
  puVar9 = (uint *)(pcVar8 + 4);
  if (pcVar8 == (char *)0x0) {
    puVar9 = (uint *)0x0;
  }
  while (puVar9 != (uint *)0x0) {
    if (*puVar9 != 0) {
      uVar2 = puVar9[1];
      uVar13 = -(uint)((uVar2 & 0xf) == 0);
      if ((uVar13 & 1) == 0) {
        iVar3 = (buf->Buf).Size;
        iVar7 = iVar3 + -1;
        if (iVar3 == 0) {
          iVar7 = 0;
        }
        ImVector<char>::reserve(&buf->Buf,iVar7 + (char)puVar9[3] * 0x32 + 0x1e);
        ImGuiTextBuffer::appendf
                  (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)*puVar9,
                   (ulong)(uint)(int)(char)puVar9[3]);
        fVar1 = (float)puVar9[2];
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
        }
        auVar5._4_4_ = -(uint)((uVar2 & 8) == 0);
        auVar5._0_4_ = uVar13;
        auVar5._8_4_ = -(uint)((uVar2 & 2) == 0);
        auVar5._12_4_ = -(uint)((uVar2 & 4) == 0);
        uVar13 = movmskps(unaff_EBP,auVar5);
        bVar10 = (byte)uVar13 >> 3;
        unaff_EBP = CONCAT31((int3)(uVar13 >> 8),bVar10);
        pbVar12 = (byte *)((long)puVar9 + 0x1b);
        for (uVar11 = 0; (int)uVar11 < (int)(char)puVar9[3]; uVar11 = uVar11 + 1) {
          ImGuiTextBuffer::appendf(buf,"Column %-2d",(ulong)uVar11);
          if (*(int *)(pbVar12 + -7) != 0) {
            ImGuiTextBuffer::appendf(buf," UserID=%08X");
          }
          if ((uVar2 & 1) != 0) {
            bVar6 = *pbVar12;
            if ((bVar6 & 8) != 0) {
              ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar12 + -0xb));
              bVar6 = *pbVar12;
            }
            if ((bVar6 & 8) == 0) {
              ImGuiTextBuffer::appendf(buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar12 + -0xb))
              ;
            }
          }
          if (bVar10 == 0) {
            ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar12 >> 2 & 1));
          }
          if ((uVar13 & 4) == 0) {
            ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar12[-2]);
          }
          if (((uVar13 & 2) == 0) && ((int)(char)pbVar12[-1] != 0xffffffff)) {
            uVar4 = 0x5e;
            if ((*pbVar12 & 3) == 1) {
              uVar4 = 0x76;
            }
            ImGuiTextBuffer::appendf(buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar12[-1],uVar4);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
          pbVar12 = pbVar12 + 0xc;
        }
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
        pcVar8 = (ctx->SettingsTables).Buf.Data;
      }
    }
    puVar9 = (uint *)((long)(int)puVar9[-1] + (long)puVar9);
    if (puVar9 == (uint *)(pcVar8 + (long)(ctx->SettingsTables).Buf.Size + 4)) {
      puVar9 = (uint *)0x0;
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}